

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O2

BaseState<false> * __thiscall
BaseState<false>::Bool(BaseState<false> *this,Context<false> *ctx,bool b)

{
  stringstream *psVar1;
  ostream *poVar2;
  undefined3 in_register_00000011;
  char *pcVar3;
  
  psVar1 = Context<false>::error_abi_cxx11_(ctx);
  poVar2 = std::operator<<((ostream *)(psVar1 + 0x10),"Unexpected token: bool (");
  pcVar3 = "false";
  if (CONCAT31(in_register_00000011,b) != 0) {
    pcVar3 = "true";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,")");
  return (BaseState<false> *)0x0;
}

Assistant:

virtual BaseState<audit>* Bool(Context<audit>& ctx, bool b)
  {
    ctx.error() << "Unexpected token: bool (" << (b ? "true" : "false") << ")";
    return nullptr;
  }